

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O1

void y_string_suite::y_string_accepted_surrogate_pairs(void)

{
  reader reader;
  char input [29];
  undefined4 local_1a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_reader<char> local_180;
  char local_38 [40];
  
  builtin_strncpy(local_38 + 0x10,"d83d\\udc8d\"]",0xd);
  builtin_strncpy(local_38,"[\"\\ud83d\\ude39\\u",0x10);
  local_1a0._M_dataplus._M_p = (pointer)strlen(local_38);
  local_1a0._M_string_length = (size_type)local_38;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_180,(view_type *)&local_1a0);
  local_1a4 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd89,"void y_string_suite::y_string_accepted_surrogate_pairs()",&local_1a0,&local_1a4
            );
  trial::protocol::json::basic_reader<char>::next(&local_180);
  local_1a0._M_dataplus._M_p._0_4_ = local_180.decoder.current.code;
  local_1a4 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd8b,"void y_string_suite::y_string_accepted_surrogate_pairs()",&local_1a0,&local_1a4
            );
  trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>(&local_1a0,&local_180);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[13]>
            ("reader.value<std::string>()",
             "\"\\xED\\xA0\\xBD\\xED\\xB8\\xB9\\xED\\xA0\\xBD\\xED\\xB2\\x8D\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd8c,"void y_string_suite::y_string_accepted_surrogate_pairs()",&local_1a0,
             anon_var_dwarf_5304);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  trial::protocol::json::basic_reader<char>::next(&local_180);
  local_1a4 = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd8e,"void y_string_suite::y_string_accepted_surrogate_pairs()",&local_1a0,&local_1a4
            );
  trial::protocol::json::basic_reader<char>::next(&local_180);
  local_1a0._M_dataplus._M_p._0_4_ = local_180.decoder.current.code;
  local_1a4 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd90,"void y_string_suite::y_string_accepted_surrogate_pairs()",&local_1a0,&local_1a4
            );
  if (local_180.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void y_string_accepted_surrogate_pairs()
{
    const char input[] = "[\"\\ud83d\\ude39\\ud83d\\udc8d\"]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "\xED\xA0\xBD\xED\xB8\xB9\xED\xA0\xBD\xED\xB2\x8D");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}